

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O2

void Sfm_LibPrintGate(Mio_Cell2_t *pCell,char *pFanins,Mio_Cell2_t *pCell2,char *pFanins2)

{
  ulong uVar1;
  
  printf(" %-20s(",pCell->pName);
  for (uVar1 = 0; uVar1 < *(uint *)&pCell->field_0x10 >> 0x1c; uVar1 = uVar1 + 1) {
    if (pFanins[uVar1] == 0x10) {
      Sfm_LibPrintGate(pCell2,pFanins2,(Mio_Cell2_t *)0x0,(char *)0x0);
    }
    else {
      printf(" %c",(ulong)((int)pFanins[uVar1] + 0x61));
    }
  }
  printf(" )");
  return;
}

Assistant:

void Sfm_LibPrintGate( Mio_Cell2_t * pCell, char * pFanins, Mio_Cell2_t * pCell2, char * pFanins2 )
{
    int k;
    printf( " %-20s(", pCell->pName );
    for ( k = 0; k < (int)pCell->nFanins; k++ )
        if ( pFanins[k] == (char)16 )
            Sfm_LibPrintGate( pCell2, pFanins2, NULL, NULL );
        else
            printf( " %c", 'a' + pFanins[k] );
    printf( " )" );
}